

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O0

Result __thiscall
GetOpt::OptionPresent::operator()
          (OptionPresent *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags param_4)

{
  pointer ppVar1;
  ulong uVar2;
  pointer ppVar3;
  _Self local_58;
  _Self local_50;
  iterator it_1;
  _Self local_40;
  iterator it;
  bool found;
  fmtflags param_4_local;
  Token *param_3_local;
  LongOptions *long_ops_local;
  ShortOptions *short_ops_local;
  OptionPresent *this_local;
  
  it._M_node._4_4_ = param_4;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
       ::find(short_ops,&this->short_opt);
  it_1._M_node = (_Base_ptr)
                 std::
                 map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                 ::end(short_ops);
  it._M_node._3_1_ = std::operator!=(&local_40,(_Self *)&it_1);
  if ((bool)it._M_node._3_1_) {
    ppVar1 = std::_Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_>::operator->
                       (&local_40);
    (ppVar1->second).flags = CmdLine_Extracted;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_50._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
           ::find(long_ops,&this->long_opt);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
           ::end(long_ops);
      it._M_node._3_1_ = std::operator!=(&local_50,&local_58);
      if ((bool)it._M_node._3_1_) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>
                 ::operator->(&local_50);
        (ppVar3->second).flags = CmdLine_Extracted;
      }
    }
  }
  if (this->present == (bool *)0x0) {
    this_local._4_4_ = OptionNotFound_NoEx;
    if ((it._M_node._3_1_ & 1) != 0) {
      this_local._4_4_ = OK;
    }
  }
  else {
    *this->present = (bool)(it._M_node._3_1_ & 1);
    this_local._4_4_ = OK;
  }
  return this_local._4_4_;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags /*flags*/) const
    {
        bool found;
        ShortOptions::iterator it = short_ops.find(short_opt);

        found = (it != short_ops.end());
        if (found)
        {
            it->second.flags = OptionData::CmdLine_Extracted;
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            found = (it != long_ops.end());
            if (found)
            {
                it->second.flags = OptionData::CmdLine_Extracted;
            }
        }

        if (present != NULL)
        {
            *present = found;
            return OK;
        }
        else
        {
            return found ? OK : OptionNotFound_NoEx;
        }
    }